

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimalControlProblem.cpp
# Opt level: O3

bool __thiscall
iDynTree::optimalcontrol::OptimalControlProblem::removeCost
          (OptimalControlProblem *this,string *name)

{
  OptimalControlProblemPimpl *pOVar1;
  size_t sVar2;
  size_t sVar3;
  pointer pbVar4;
  pointer pcVar5;
  size_t __n;
  int iVar6;
  ostream *poVar7;
  pointer pbVar8;
  long *plVar9;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::optimalcontrol::TimedCost>_>,_std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::optimalcontrol::TimedCost>_>_>
  pVar10;
  ostringstream errorMsg;
  long *local_1c8;
  long local_1b8 [2];
  long *local_1a8;
  size_t local_1a0;
  long local_198 [12];
  ios_base local_138 [264];
  
  pOVar1 = this->m_pimpl;
  pVar10 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::optimalcontrol::TimedCost>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::optimalcontrol::TimedCost>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::optimalcontrol::TimedCost>_>_>
           ::equal_range(&(pOVar1->costs)._M_t,name);
  sVar2 = (pOVar1->costs)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::optimalcontrol::TimedCost>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::optimalcontrol::TimedCost>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::optimalcontrol::TimedCost>_>_>
  ::_M_erase_aux(&(pOVar1->costs)._M_t,(_Base_ptr)pVar10.first._M_node,
                 (_Base_ptr)pVar10.second._M_node);
  sVar3 = (pOVar1->costs)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  if (sVar2 == sVar3) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,"Failed to remove cost named ",0x1c);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&local_1a8,(name->_M_dataplus)._M_p,name->_M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    std::__cxx11::stringbuf::str();
    iDynTree::reportError("OptimalControlProblem","removeCost",(char *)local_1c8);
    if (local_1c8 != local_1b8) {
      operator_delete(local_1c8,local_1b8[0] + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
    std::ios_base::~ios_base(local_138);
  }
  else {
    pbVar8 = (this->m_pimpl->mayerCostnames).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pbVar4 = (this->m_pimpl->mayerCostnames).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pbVar8 != pbVar4) {
      do {
        pcVar5 = (pbVar8->_M_dataplus)._M_p;
        local_1a8 = local_198;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1a8,pcVar5,pcVar5 + pbVar8->_M_string_length);
        plVar9 = local_1a8;
        __n = name->_M_string_length;
        if ((__n == local_1a0) &&
           ((__n == 0 || (iVar6 = bcmp((name->_M_dataplus)._M_p,local_1a8,__n), iVar6 == 0)))) {
          local_1a0 = 0;
          *(undefined1 *)plVar9 = 0;
          plVar9 = local_1a8;
        }
        if (plVar9 != local_198) {
          operator_delete(plVar9,local_198[0] + 1);
        }
        pbVar8 = pbVar8 + 1;
      } while (pbVar8 != pbVar4);
    }
  }
  return sVar2 != sVar3;
}

Assistant:

bool OptimalControlProblem::removeCost(const std::string &name)
        {
            if (m_pimpl->costs.erase(name)){
                for (auto mayerCost : m_pimpl->mayerCostnames) {
                    if (name == mayerCost) {
                        mayerCost.erase();
                    }
                }
                return true;
            }

            std::ostringstream errorMsg;
            errorMsg << "Failed to remove cost named "<<name<< std::endl;
            reportError("OptimalControlProblem", "removeCost", errorMsg.str().c_str());
            return false;
        }